

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O2

int array_hash(char *array,int modulus)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numvars;
  if (numvars < 1) {
    uVar2 = uVar3;
  }
  iVar4 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar4 = iVar4 * 0x3e5 + *(int *)(array + uVar3 * 4);
  }
  iVar1 = -iVar4;
  if (0 < iVar4) {
    iVar1 = iVar4;
  }
  return iVar1 % modulus;
}

Assistant:

static int
array_hash(
  const char * array,
  int  modulus)
{
    int val = 0;
    int i;
    int *intarray;

    intarray = (int *) array;

    for (i = 0; i < numvars; i++) {
        val = val * 997 + intarray[i];
    }

    return ((val < 0) ? -val : val) % modulus;

}